

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

void rsa2_sign(ssh_key *key,ptrlen data,uint flags,BinarySink *bs)

{
  BinarySink *bs_00;
  uint8_t val;
  size_t sVar1;
  uchar *b;
  mp_int *input;
  mp_int *x;
  uint uVar2;
  ssh_hashalg *halg;
  char *str;
  ulong uVar3;
  bool bVar4;
  ptrlen bytes;
  
  uVar2 = flags | *key->vt->extra;
  bVar4 = (uVar2 & 4) == 0;
  str = "rsa-sha2-512";
  if (bVar4) {
    str = "ssh-rsa";
  }
  halg = &ssh_sha512;
  if (bVar4) {
    halg = &ssh_sha1;
  }
  if ((uVar2 & 2) != 0) {
    str = "rsa-sha2-256";
    halg = &ssh_sha256;
  }
  sVar1 = mp_get_nbits((mp_int *)key[-7].vt);
  uVar3 = sVar1 + 7 >> 3;
  b = rsa_pkcs1_signature_string(uVar3,halg,data);
  bytes.len = uVar3;
  bytes.ptr = b;
  input = mp_from_bytes_be(bytes);
  smemclr(b,uVar3);
  safefree(b);
  x = rsa_privkey_op(input,(RSAKey *)(key + -8));
  mp_free(input);
  BinarySink_put_stringz(bs->binarysink_,str);
  sVar1 = mp_get_nbits(x);
  uVar3 = sVar1 + 7 >> 3;
  BinarySink_put_uint32(bs->binarysink_,uVar3);
  if (7 < sVar1 + 7) {
    do {
      uVar3 = uVar3 - 1;
      bs_00 = bs->binarysink_;
      val = mp_get_byte(x,uVar3);
      BinarySink_put_byte(bs_00,val);
    } while (uVar3 != 0);
  }
  mp_free(x);
  return;
}

Assistant:

static void rsa2_sign(ssh_key *key, ptrlen data,
                      unsigned flags, BinarySink *bs)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    unsigned char *bytes;
    size_t nbytes;
    mp_int *in, *out;
    const ssh_hashalg *halg;
    const char *sign_alg_name;

    const struct ssh2_rsa_extra *extra =
        (const struct ssh2_rsa_extra *)key->vt->extra;
    flags |= extra->signflags;

    halg = rsa2_hash_alg_for_flags(flags, &sign_alg_name);

    nbytes = (mp_get_nbits(rsa->modulus) + 7) / 8;

    bytes = rsa_pkcs1_signature_string(nbytes, halg, data);
    in = mp_from_bytes_be(make_ptrlen(bytes, nbytes));
    smemclr(bytes, nbytes);
    sfree(bytes);

    out = rsa_privkey_op(in, rsa);
    mp_free(in);

    put_stringz(bs, sign_alg_name);
    nbytes = (mp_get_nbits(out) + 7) / 8;
    put_uint32(bs, nbytes);
    for (size_t i = 0; i < nbytes; i++)
        put_byte(bs, mp_get_byte(out, nbytes - 1 - i));

    mp_free(out);
}